

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall
CTcPrsOpRel::eval_constant(CTcPrsOpRel *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  long val;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar4;
  int *piVar5;
  vbignum_t ext;
  char *pcVar6;
  vbignum_t a;
  vbignum_t b;
  vbignum_t local_40;
  vbignum_t local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar2 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if ((CONCAT44(extraout_var,iVar2) == 0) ||
     (iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right),
     CONCAT44(extraout_var_00,iVar2) == 0)) {
    return (CTcPrsNode *)0x0;
  }
  iVar2 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  piVar4 = (int *)CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  piVar5 = (int *)CONCAT44(extraout_var_02,iVar2);
  iVar2 = *piVar4;
  iVar1 = *piVar5;
  if ((iVar2 == 3) && (iVar1 == 3)) {
    uVar3 = 0xffffffff;
    if (*(long *)(piVar5 + 2) <= *(long *)(piVar4 + 2)) {
      uVar3 = (uint)(*(long *)(piVar4 + 2) != *(long *)(piVar5 + 2));
    }
    goto LAB_0022bb70;
  }
  if ((iVar2 == 4) && (iVar1 == 4)) {
    uVar3 = strcmp(*(char **)(piVar4 + 2),*(char **)(piVar5 + 2));
    goto LAB_0022bb70;
  }
  if ((iVar2 == 0xd) && (iVar1 == 0xd)) {
    vbignum_t::vbignum_t(&local_40,*(char **)(piVar4 + 2),*(size_t *)(piVar4 + 4),0);
    vbignum_t::vbignum_t(&local_38,*(char **)(piVar5 + 2),*(size_t *)(piVar5 + 4),0);
    uVar3 = CVmObjBigNum::compare_ext(local_40.ext_,local_38.ext_);
LAB_0022baf0:
    ext.ext_ = local_38.ext_;
    if (local_38.ext_ != (char *)0x0) goto LAB_0022bb5c;
  }
  else {
    if ((iVar2 != 0xd) || (iVar1 != 3)) {
      if ((iVar2 != 3) || (iVar1 != 0xd)) {
        pcVar6 = CTcTokenizer::get_op_text((this->super_CTcPrsOpBin).op_tok_);
        CTcTokenizer::log_error(0x2b06,pcVar6);
        return (CTcPrsNode *)0x0;
      }
      vbignum_t::vbignum_t(&local_40,*(long *)(piVar4 + 2));
      vbignum_t::vbignum_t(&local_38,*(char **)(piVar5 + 2),*(size_t *)(piVar5 + 4),0);
      uVar3 = CVmObjBigNum::compare_ext(local_40.ext_,local_38.ext_);
      goto LAB_0022baf0;
    }
    vbignum_t::vbignum_t(&local_40,*(char **)(piVar4 + 2),*(size_t *)(piVar4 + 4),0);
    val = *(long *)(piVar5 + 2);
    ext.ext_ = (char *)operator_new__(10);
    ext.ext_[0] = '\n';
    ext.ext_[1] = '\0';
    ext.ext_[4] = '\0';
    CVmObjBigNum::set_int_val(ext.ext_,val);
    uVar3 = CVmObjBigNum::compare_ext(local_40.ext_,ext.ext_);
LAB_0022bb5c:
    operator_delete__(ext.ext_);
  }
  if (local_40.ext_ != (char *)0x0) {
    operator_delete__(local_40.ext_);
  }
LAB_0022bb70:
  iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[3])(this,(ulong)uVar3);
  *piVar4 = 2 - (uint)(iVar2 == 0);
  return left;
}

Assistant:

CTcPrsNode *CTcPrsOpRel::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        /* get the types */
        CTcConstVal *c1 = left->get_const_val();
        CTcConstVal *c2 = right->get_const_val();
        tc_constval_type_t typ1 = c1->get_type();
        tc_constval_type_t typ2 = c2->get_type();

        /* determine what we're comparing */
        int sense;
        if (typ1 == TC_CVT_INT && typ2 == TC_CVT_INT)
        {
            /* get the values */
            long val1 = c1->get_val_int();
            long val2 = c2->get_val_int();

            /* calculate the sense of the integer comparison */
            sense = (val1 < val2 ? -1 : val1 == val2 ? 0 : 1);
        }
        else if (typ1 == TC_CVT_SSTR && typ2 == TC_CVT_SSTR)
        {
            /* compare the string values */
            sense = strcmp(c1->get_val_str(), c2->get_val_str());
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_FLOAT)
        {
            /* both are floats - get as BigNumber values */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            sense = a.compare(b);
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_INT)
        {
            /* float vs int */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_int());
            sense = a.compare(b);
        }
        else if (typ1 == TC_CVT_INT && typ2 == TC_CVT_FLOAT)
        {
            vbignum_t a(c1->get_val_int());
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            sense = a.compare(b);
        }
        else
        {
            /* these types are incomparable */
            G_tok->log_error(TCERR_CONST_BAD_COMPARE,
                             G_tok->get_op_text(get_op_tok()));
            return 0;
        }

        /* set the result in the left value */
        c1->set_bool(get_bool_val(sense));

        /* return the updated left value */
        return left;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}